

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListAppend(Parse *pParse,SrcList *pList,Token *pTable,Token *pDatabase)

{
  char *pcVar1;
  char **ppcVar2;
  long *in_RCX;
  SrcList *in_RDX;
  Parse *in_RSI;
  undefined8 *in_RDI;
  SrcList *pNew;
  sqlite3 *db;
  SrcItem *pItem;
  Token *in_stack_ffffffffffffffb8;
  sqlite3 *in_stack_ffffffffffffffc0;
  sqlite3 *db_00;
  sqlite3 *db_01;
  int *piVar3;
  sqlite3 *local_8;
  
  db_01 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  db_00 = (sqlite3 *)*in_RDI;
  if (in_RSI == (Parse *)0x0) {
    local_8 = (sqlite3 *)sqlite3DbMallocRawNN(db_00,(u64)in_stack_ffffffffffffffc0);
    if (local_8 == (sqlite3 *)0x0) {
      return (SrcList *)0x0;
    }
    *(u32 *)((long)&local_8->pVfs + 4) = 1;
    *(int *)&local_8->pVfs = 1;
    memset((SrcItem *)&local_8->pVdbe,0,0x48);
    ((anon_struct_4_19_bb8b771d_for_fg *)&local_8->aDb)[1] =
         (anon_struct_4_19_bb8b771d_for_fg)0xffffffff;
  }
  else {
    in_stack_ffffffffffffffc0 =
         (sqlite3 *)sqlite3SrcListEnlarge(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX);
    local_8 = in_stack_ffffffffffffffc0;
    if (in_stack_ffffffffffffffc0 == (sqlite3 *)0x0) {
      sqlite3SrcListDelete(db_01,(SrcList *)db_00);
      return (SrcList *)0x0;
    }
  }
  piVar3 = local_8->aLimit + (long)(*(int *)&local_8->pVfs + -1) * 0x12 + -0x20;
  if ((in_RCX != (long *)0x0) && (*in_RCX == 0)) {
    in_RCX = (long *)0x0;
  }
  if (in_RCX == (long *)0x0) {
    pcVar1 = sqlite3NameFromToken(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *(char **)piVar3 = pcVar1;
    *(char ***)(piVar3 + 0x10) = (char **)0x0;
  }
  else {
    pcVar1 = sqlite3NameFromToken(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *(char **)piVar3 = pcVar1;
    ppcVar2 = (char **)sqlite3NameFromToken(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *(char ***)(piVar3 + 0x10) = ppcVar2;
  }
  return (SrcList *)local_8;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppend(
  Parse *pParse,      /* Parsing context, in which errors are reported */
  SrcList *pList,     /* Append to this SrcList. NULL creates a new SrcList */
  Token *pTable,      /* Table to append */
  Token *pDatabase    /* Database of the table */
){
  SrcItem *pItem;
  sqlite3 *db;
  assert( pDatabase==0 || pTable!=0 );  /* Cannot have C without B */
  assert( pParse!=0 );
  assert( pParse->db!=0 );
  db = pParse->db;
  if( pList==0 ){
    pList = sqlite3DbMallocRawNN(pParse->db, sizeof(SrcList) );
    if( pList==0 ) return 0;
    pList->nAlloc = 1;
    pList->nSrc = 1;
    memset(&pList->a[0], 0, sizeof(pList->a[0]));
    pList->a[0].iCursor = -1;
  }else{
    SrcList *pNew = sqlite3SrcListEnlarge(pParse, pList, 1, pList->nSrc);
    if( pNew==0 ){
      sqlite3SrcListDelete(db, pList);
      return 0;
    }else{
      pList = pNew;
    }
  }
  pItem = &pList->a[pList->nSrc-1];
  if( pDatabase && pDatabase->z==0 ){
    pDatabase = 0;
  }
  assert( pItem->fg.fixedSchema==0 );
  assert( pItem->fg.isSubquery==0 );
  if( pDatabase ){
    pItem->zName = sqlite3NameFromToken(db, pDatabase);
    pItem->u4.zDatabase = sqlite3NameFromToken(db, pTable);
  }else{
    pItem->zName = sqlite3NameFromToken(db, pTable);
    pItem->u4.zDatabase = 0;
  }
  return pList;
}